

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosRangeFilter.cpp
# Opt level: O2

size_t __thiscall adios2::helper::RangeFilter::ToSizeT(RangeFilter *this,string *input)

{
  size_t sVar1;
  allocator local_bb;
  allocator local_ba;
  allocator local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  string local_38;
  size_t pos;
  
  sVar1 = std::__cxx11::stol(input,&pos,10);
  if ((long)sVar1 < 0) {
    std::__cxx11::string::string((string *)&local_38,"Helper",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"adiosRangeFilter",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"ToSizeT",&local_bb);
    std::operator+(&local_b8,"Negative number \'",input);
    std::operator+(&local_98,&local_b8,"\' not supported in range selections!");
    ThrowNested<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (pos < input->_M_string_length) {
    std::__cxx11::string::string((string *)&local_38,"Helper",&local_b9);
    std::__cxx11::string::string((string *)&local_58,"adiosRangeFilter",&local_ba);
    std::__cxx11::string::string((string *)&local_78,"ToSizeT",&local_bb);
    std::operator+(&local_b8,"could not cast the entire string \'",input);
    std::operator+(&local_98,&local_b8,
                   "\' to a single integer number. RangeFilter accepts a space-separated list of i:j:k expressions where i,j,k are non-negative integers or the character \'n\'"
                  );
    ThrowNested<std::invalid_argument>(&local_38,&local_58,&local_78,&local_98,-1);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar1;
}

Assistant:

size_t RangeFilter::ToSizeT(const std::string &input)
{
    long value;
    size_t pos;
    try
    {
        value = std::stol(input, &pos);
    }
    catch (...)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "could not cast string '" + input +
                                                       "' to number ");
    }
    if (value < 0L)
    {
        helper::ThrowNested<std::invalid_argument>("Helper", "adiosRangeFilter", "ToSizeT",
                                                   "Negative number '" + input +
                                                       "' not supported in range selections!");
    }
    if (pos < input.size())
    {
        helper::ThrowNested<std::invalid_argument>(
            "Helper", "adiosRangeFilter", "ToSizeT",
            "could not cast the entire string '" + input +
                "' to a single integer number. RangeFilter accepts a "
                "space-separated list of i:j:k expressions where i,j,k are "
                "non-negative integers or the character 'n'");
    }
    return static_cast<size_t>(value);
}